

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_file_reader.hpp
# Opt level: O1

void __thiscall
duckdb::BaseFileReader::AddVirtualColumn(BaseFileReader *this,column_t virtual_column_id)

{
  InternalException *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Reader %s does not support AddVirtualColumn","");
  (*this->_vptr_BaseFileReader[2])(&local_40,this);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_60,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

virtual void AddVirtualColumn(column_t virtual_column_id) {
		throw InternalException("Reader %s does not support AddVirtualColumn", GetReaderType());
	}